

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMaterialShellKirchhoff.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChDampingKirchhoff::ComputeDampingMatrix
          (ChDampingKirchhoff *this,ChMatrixRef *R,ChVector<double> *deps,ChVector<double> *dkur,
          double z_inf,double z_sup,double angle)

{
  long lVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  ChMatrixRef *pCVar6;
  uint uVar7;
  double *pdVar8;
  long lVar9;
  ActualDstType actualDst;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  ChVectorN<double,_6> stress_1;
  ChVectorN<double,_6> dstrain_0;
  ChVector<double> m;
  ChVector<double> n;
  ChVectorN<double,_6> stress_0;
  ChVectorN<double,_6> stress_d;
  ChVector<double> ddeps;
  ChVector<double> ddkur;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
  local_1f8;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined1 local_1b8 [56];
  ulong local_180;
  void *local_178;
  void *local_170;
  ulong local_168;
  void *local_160;
  void *local_158;
  ulong local_150;
  ChMatrixRef *local_148;
  ulong local_140;
  ulong local_138;
  ulong local_130;
  ulong local_128;
  long local_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  SrcEvaluatorType local_d8;
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  double local_a8;
  double dStack_a0;
  double local_98 [7];
  ChVector<double> local_60;
  ChVector<double> local_48;
  
  if ((R->
      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      ).
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
      .
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
      .m_rows.m_value != 6) {
    __assert_fail("R.rows() == 6",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/fea/ChMaterialShellKirchhoff.cpp"
                  ,0x173,
                  "virtual void chrono::fea::ChDampingKirchhoff::ComputeDampingMatrix(ChMatrixRef, const ChVector<> &, const ChVector<> &, const double, const double, const double)"
                 );
  }
  if ((R->
      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      ).
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
      .
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
      .m_cols.m_value != 6) {
    __assert_fail("R.cols() == 6",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/fea/ChMaterialShellKirchhoff.cpp"
                  ,0x174,
                  "virtual void chrono::fea::ChDampingKirchhoff::ComputeDampingMatrix(ChMatrixRef, const ChVector<> &, const ChVector<> &, const double, const double, const double)"
                 );
  }
  local_1f8.m_src = &local_d8;
  local_d8.m_functor.m_other = 0.0;
  local_1b8._0_8_ =
       (R->
       super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
       ).
       super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
       .
       super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
       .m_data;
  local_1f8.m_dst = (DstEvaluatorType *)local_1b8;
  local_1b8._16_8_ =
       (R->
       super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
       ).m_stride.m_outer.m_value;
  local_1f8.m_functor = (assign_op<double,_double> *)local_98;
  local_1f8.m_dstExpr = R;
  Eigen::internal::
  dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
  ::run(&local_1f8);
  uVar7 = -((uint)((ulong)local_1b8 >> 3) & 0x1fffffff) & 6;
  uVar10 = 3;
  if (uVar7 < 3) {
    uVar10 = uVar7;
  }
  if (uVar7 != 0) {
    memcpy(local_1b8,deps,(ulong)(uVar10 * 8));
  }
  if (uVar10 != 3) {
    uVar11 = (ulong)(uVar10 << 3);
    memcpy(local_1b8 + uVar11,(void *)((long)deps->m_data + uVar11),0x18 - uVar11);
  }
  uVar7 = -((uint)((ulong)(local_1b8 + 0x18) >> 3) & 0x1fffffff) & 7;
  uVar10 = 3;
  if (uVar7 < 3) {
    uVar10 = uVar7;
  }
  memcpy(local_1b8 + 0x18,dkur,(ulong)(uVar10 * 8));
  if (uVar7 < 3) {
    uVar11 = (ulong)(uVar10 << 3);
    memcpy(local_1b8 + uVar11 + 0x18,(void *)((long)dkur->m_data + uVar11),0x18 - uVar11);
  }
  local_f8 = 0;
  uStack_f0 = 0;
  local_e8 = 0;
  local_108 = 0;
  local_118 = 0;
  uStack_110 = 0;
  (*this->_vptr_ChDampingKirchhoff[2])(z_inf,z_sup,angle);
  uVar7 = -((uint)((ulong)&local_d8 >> 3) & 0x1fffffff) & 6;
  uVar10 = 3;
  if (uVar7 < 3) {
    uVar10 = uVar7;
  }
  if (uVar7 != 0) {
    memcpy(&local_d8,&local_f8,(ulong)(uVar10 * 8));
  }
  if (uVar10 != 3) {
    uVar11 = (ulong)(uVar10 << 3);
    memcpy((void *)((long)&local_d8.m_functor.m_other + uVar11),(void *)((long)&local_f8 + uVar11),
           0x18 - uVar11);
  }
  memcpy(local_c8 + 8,&local_118,0);
  memcpy(local_c8 + 8,&local_118,0x18);
  local_128 = (ulong)(-((uint)((ulong)&local_1f8 >> 3) & 0x1fffffff) & 6);
  local_130 = 3;
  if (local_128 < 3) {
    local_130 = local_128;
  }
  uVar7 = -((uint)((ulong)&local_1f8.m_dstExpr >> 3) & 0x1fffffff) & 7;
  local_138 = (ulong)uVar7;
  uVar10 = 3;
  if (local_138 < 3) {
    uVar10 = uVar7;
  }
  local_150 = (ulong)(uint)((int)local_130 * 8);
  local_158 = (void *)((long)&local_1f8.m_dst + local_150);
  local_160 = (void *)((long)&local_f8 + local_150);
  local_168 = local_150 ^ 0x18;
  local_140 = (ulong)(uVar10 << 3);
  local_170 = (void *)((long)&local_1f8.m_dstExpr + local_140);
  local_178 = (void *)((long)&local_118 + local_140);
  local_180 = local_140 ^ 0x18;
  local_120 = 0;
  local_a8 = 999999999.9999999;
  dStack_a0 = 999999999.9999999;
  lVar12 = 0;
  local_148 = R;
  while( true ) {
    *(double *)(local_1b8 + lVar12 * 8) = *(double *)(local_1b8 + lVar12 * 8) + 1e-09;
    local_1f8.m_src = (SrcEvaluatorType *)0x3;
    local_1d8 = 0;
    local_1c8 = 6;
    local_1f8.m_dst = (DstEvaluatorType *)local_1b8;
    local_1f8.m_dstExpr = (DstXprType *)local_1b8;
    ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false>>
              (&local_60,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_> *)
               &local_1f8,(type *)0x0);
    local_1f8.m_dst = (DstEvaluatorType *)(local_1b8 + 0x18);
    local_1f8.m_src = (SrcEvaluatorType *)0x3;
    local_1d8 = 3;
    local_1c8 = 6;
    local_1f8.m_dstExpr = (DstXprType *)local_1b8;
    ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false>>
              (&local_48,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_> *)
               &local_1f8,(type *)0x0);
    (*this->_vptr_ChDampingKirchhoff[2])
              (z_inf,z_sup,angle,this,&local_f8,&local_118,&local_60,&local_48);
    if (local_128 != 0) {
      memcpy(&local_1f8,&local_f8,local_150);
    }
    pCVar6 = local_148;
    if ((int)local_130 != 3) {
      memcpy(local_158,local_160,local_168);
    }
    memcpy(&local_1f8.m_dstExpr,&local_118,local_140);
    if ((uint)local_138 < 3) {
      memcpy(local_170,local_178,local_180);
    }
    auVar2._8_8_ = local_1f8.m_src;
    auVar2._0_8_ = local_1f8.m_dst;
    auVar3._8_8_ = local_1f8.m_dstExpr;
    auVar3._0_8_ = local_1f8.m_functor;
    auVar4._8_8_ = uStack_1d0;
    auVar4._0_8_ = local_1d8;
    auVar5._8_8_ = local_d8._8_8_;
    auVar5._0_8_ = local_d8.m_functor.m_other;
    auVar2 = vsubpd_avx(auVar2,auVar5);
    local_98[0] = auVar2._0_8_ * local_a8;
    local_98[1] = auVar2._8_8_ * dStack_a0;
    auVar2 = vsubpd_avx(auVar3,local_c8);
    local_98[2] = auVar2._0_8_ * local_a8;
    local_98[3] = auVar2._8_8_ * dStack_a0;
    auVar2 = vsubpd_avx(auVar4,local_b8);
    local_98[4] = auVar2._0_8_ * local_a8;
    local_98[5] = auVar2._8_8_ * dStack_a0;
    if (((pCVar6->
         super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
         ).
         super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
         .
         super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
         .m_rows.m_value < 6) ||
       ((pCVar6->
        super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
        ).
        super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
        .
        super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
        .m_cols.m_value <= lVar12)) break;
    lVar1 = (pCVar6->
            super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
            ).m_stride.m_outer.m_value;
    pdVar8 = (double *)
             ((long)(pCVar6->
                    super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                    ).
                    super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                    .
                    super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                    .m_data + local_120);
    lVar9 = 0;
    do {
      *pdVar8 = local_98[lVar9];
      lVar9 = lVar9 + 1;
      pdVar8 = pdVar8 + lVar1;
    } while (lVar9 != 6);
    *(double *)(local_1b8 + lVar12 * 8) = *(double *)(local_1b8 + lVar12 * 8) + -1e-09;
    lVar12 = lVar12 + 1;
    local_120 = local_120 + 8;
    if (lVar12 == 6) {
      return;
    }
  }
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                "Eigen::Block<Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, BlockRows = -1, BlockCols = -1, InnerPanel = false]"
               );
}

Assistant:

void ChDampingKirchhoff::ComputeDampingMatrix(
    ChMatrixRef R,             // 6x6 material damping matrix values here
    const ChVector<>& deps,  // time derivative of strains 
    const ChVector<>& dkur,  // time derivative of curvatures
    const double z_inf,        // layer lower z value (along thickness coord)
    const double z_sup,        // layer upper z value (along thickness coord)
    const double angle         // layer angle respect to x (if needed) -not used in this, isotropic+
) {
    assert(R.rows() == 6);
    assert(R.cols() == 6);

    R.setZero();

    ChVectorN<double, 6> dstrain_0;
    dstrain_0.segment(0, 3) = deps.eigen();
    dstrain_0.segment(3, 3) = dkur.eigen();

    ChVector<> n, m;
    this->ComputeStress(n, m, deps, dkur, z_inf, z_sup, angle);

    ChVectorN<double, 6> stress_0;
    stress_0.segment(0,3) = n.eigen();
    stress_0.segment(3,3) = m.eigen();
    

    double delta = 1e-9;
    for (int i = 0; i < 6; ++i) {
        dstrain_0(i, 0) += delta;
        ChVector<> ddeps(dstrain_0.segment(0, 3));
        ChVector<> ddkur(dstrain_0.segment(3, 3));
        this->ComputeStress(n, m, ddeps, ddkur, z_inf, z_sup, angle);
        ChVectorN<double, 6> stress_1;
        stress_1.segment(0,3) = n.eigen();
        stress_1.segment(3,3) = m.eigen();
        ChVectorN<double, 6> stress_d = (1. / delta) * (stress_1 - stress_0);
        R.block(0, i, 6, 1) = stress_d;
        dstrain_0(i, 0) -= delta;
    }
}